

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

StringRef __thiscall
llvm::yaml::ScalarNode::getValue(ScalarNode *this,SmallVectorImpl<char> *Storage)

{
  long lVar1;
  ScalarNode *pSVar2;
  StringRef UnquotedValue_00;
  char cVar3;
  unsigned_long *puVar4;
  size_type sVar5;
  size_t sVar6;
  iterator pcVar7;
  iterator pcVar8;
  size_t sVar9;
  StringRef *pSVar10;
  char *pcVar11;
  char local_241;
  undefined1 local_240 [8];
  StringRef Valid;
  size_type i_1;
  StringRef UnquotedValue_1;
  StringRef local_208;
  size_type i;
  StringRef UnquotedValue;
  SmallVectorImpl<char> *Storage_local;
  ScalarNode *this_local;
  char *local_1c8;
  unsigned_long local_158 [3];
  StringRef *local_140;
  undefined1 local_138 [16];
  char *local_128;
  size_type local_120;
  undefined1 *local_118;
  unsigned_long local_110;
  unsigned_long local_108;
  unsigned_long local_100;
  StringRef *local_f8;
  undefined1 local_f0 [16];
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  unsigned_long local_c8;
  unsigned_long local_c0;
  unsigned_long local_b8;
  StringRef *local_b0;
  undefined1 local_a8 [16];
  char *local_98;
  char *local_90;
  undefined1 *local_88;
  size_type *local_80;
  StringRef *local_78;
  StringRef *local_70;
  void *local_68;
  void *P_1;
  size_t FindBegin_1;
  char local_49;
  size_type *local_48;
  size_t local_40;
  void *local_38;
  void *P;
  size_t FindBegin;
  char local_19;
  size_type *local_18;
  size_t local_10;
  
  UnquotedValue.Length = (size_t)Storage;
  cVar3 = StringRef::operator[](&this->Value,0);
  if (cVar3 == '\"') {
    pSVar10 = &this->Value;
    local_c0 = (this->Value).Length - 2;
    local_b8 = 1;
    local_b0 = pSVar10;
    local_70 = pSVar10;
    puVar4 = std::min<unsigned_long>(&local_b8,&(this->Value).Length);
    local_b8 = *puVar4;
    pcVar11 = pSVar10->Data + local_b8;
    local_c8 = (this->Value).Length - local_b8;
    puVar4 = std::min<unsigned_long>(&local_c0,&local_c8);
    UnquotedValue.Data = (char *)*puVar4;
    local_88 = local_a8;
    i = (size_type)pcVar11;
    local_98 = UnquotedValue.Data;
    local_90 = pcVar11;
    strlen("\\\r\n");
    sVar5 = StringRef::find_first_of((StringRef *)&i,local_208,0);
    if (sVar5 == 0xffffffffffffffff) {
      local_1c8 = UnquotedValue.Data;
      this_local = (ScalarNode *)i;
    }
    else {
      UnquotedValue_1.Length = i;
      UnquotedValue_00.Length = (size_t)UnquotedValue.Data;
      UnquotedValue_00.Data = (char *)i;
      _this_local = unescapeDoubleQuoted
                              (this,UnquotedValue_00,sVar5,
                               (SmallVectorImpl<char> *)UnquotedValue.Length);
    }
  }
  else {
    cVar3 = StringRef::operator[](&this->Value,0);
    if (cVar3 == '\'') {
      pSVar10 = &this->Value;
      local_108 = (this->Value).Length - 2;
      local_100 = 1;
      local_f8 = pSVar10;
      local_78 = pSVar10;
      puVar4 = std::min<unsigned_long>(&local_100,&(this->Value).Length);
      local_100 = *puVar4;
      pcVar11 = pSVar10->Data + local_100;
      local_110 = (this->Value).Length - local_100;
      puVar4 = std::min<unsigned_long>(&local_108,&local_110);
      UnquotedValue_1.Data = (char *)*puVar4;
      local_d0 = local_f0;
      local_18 = &i_1;
      local_19 = '\'';
      FindBegin = 0;
      i_1 = (size_type)pcVar11;
      local_e0 = UnquotedValue_1.Data;
      local_d8 = pcVar11;
      puVar4 = std::min<unsigned_long>(&FindBegin,(unsigned_long *)&UnquotedValue_1);
      P = (void *)*puVar4;
      if ((P < UnquotedValue_1.Data) &&
         (local_38 = memchr((char *)((long)P + i_1),(int)local_19,
                            (long)UnquotedValue_1.Data - (long)P), local_38 != (void *)0x0)) {
        local_10 = (long)local_38 - i_1;
      }
      else {
        local_10 = 0xffffffffffffffff;
      }
      Valid.Length = local_10;
      if (local_10 == 0xffffffffffffffff) {
        local_1c8 = UnquotedValue_1.Data;
        this_local = (ScalarNode *)i_1;
      }
      else {
        SmallVectorImpl<char>::clear((SmallVectorImpl<char> *)UnquotedValue.Length);
        local_80 = &i_1;
        SmallVectorImpl<char>::reserve
                  ((SmallVectorImpl<char> *)UnquotedValue.Length,(size_type)UnquotedValue_1.Data);
        while (sVar9 = UnquotedValue.Length, Valid.Length != 0xffffffffffffffff) {
          local_240 = (undefined1  [8])StringRef::begin((StringRef *)&i_1);
          sVar9 = UnquotedValue.Length;
          Valid.Data = (char *)Valid.Length;
          lVar1 = *(long *)UnquotedValue.Length;
          sVar6 = SmallVectorBase::size((SmallVectorBase *)UnquotedValue.Length);
          pcVar7 = StringRef::begin((StringRef *)local_240);
          pcVar8 = StringRef::end((StringRef *)local_240);
          SmallVectorImpl<char>::insert<char_const*,void>
                    ((SmallVectorImpl<char> *)sVar9,(iterator)(lVar1 + sVar6),pcVar7,pcVar8);
          local_241 = '\'';
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)UnquotedValue.Length,&local_241);
          local_158[2] = Valid.Length + 2;
          local_158[1] = 0xffffffffffffffff;
          local_140 = (StringRef *)&i_1;
          puVar4 = std::min<unsigned_long>(local_158 + 2,(unsigned_long *)&UnquotedValue_1);
          local_158[2] = *puVar4;
          sVar5 = i_1 + local_158[2];
          local_158[0] = (long)UnquotedValue_1.Data - local_158[2];
          puVar4 = std::min<unsigned_long>(local_158 + 1,local_158);
          UnquotedValue_1.Data = (char *)*puVar4;
          local_118 = local_138;
          local_48 = &i_1;
          local_49 = '\'';
          FindBegin_1 = 0;
          i_1 = sVar5;
          local_128 = UnquotedValue_1.Data;
          local_120 = sVar5;
          puVar4 = std::min<unsigned_long>(&FindBegin_1,(unsigned_long *)&UnquotedValue_1);
          P_1 = (void *)*puVar4;
          if ((P_1 < UnquotedValue_1.Data) &&
             (local_68 = memchr((char *)((long)P_1 + i_1),(int)local_49,
                                (long)UnquotedValue_1.Data - (long)P_1), local_68 != (void *)0x0)) {
            local_40 = (long)local_68 - i_1;
          }
          else {
            local_40 = 0xffffffffffffffff;
          }
          Valid.Length = local_40;
        }
        lVar1 = *(long *)UnquotedValue.Length;
        sVar6 = SmallVectorBase::size((SmallVectorBase *)UnquotedValue.Length);
        pcVar7 = StringRef::begin((StringRef *)&i_1);
        pcVar8 = StringRef::end((StringRef *)&i_1);
        SmallVectorImpl<char>::insert<char_const*,void>
                  ((SmallVectorImpl<char> *)sVar9,(iterator)(lVar1 + sVar6),pcVar7,pcVar8);
        pSVar2 = *(ScalarNode **)UnquotedValue.Length;
        sVar9 = SmallVectorBase::size((SmallVectorBase *)UnquotedValue.Length);
        this_local = pSVar2;
        local_1c8 = (char *)sVar9;
      }
    }
    else {
      _this_local = StringRef::rtrim(&this->Value,' ');
    }
  }
  return _this_local;
}

Assistant:

StringRef ScalarNode::getValue(SmallVectorImpl<char> &Storage) const {
  // TODO: Handle newlines properly. We need to remove leading whitespace.
  if (Value[0] == '"') { // Double quoted.
    // Pull off the leading and trailing "s.
    StringRef UnquotedValue = Value.substr(1, Value.size() - 2);
    // Search for characters that would require unescaping the value.
    StringRef::size_type i = UnquotedValue.find_first_of("\\\r\n");
    if (i != StringRef::npos)
      return unescapeDoubleQuoted(UnquotedValue, i, Storage);
    return UnquotedValue;
  } else if (Value[0] == '\'') { // Single quoted.
    // Pull off the leading and trailing 's.
    StringRef UnquotedValue = Value.substr(1, Value.size() - 2);
    StringRef::size_type i = UnquotedValue.find('\'');
    if (i != StringRef::npos) {
      // We're going to need Storage.
      Storage.clear();
      Storage.reserve(UnquotedValue.size());
      for (; i != StringRef::npos; i = UnquotedValue.find('\'')) {
        StringRef Valid(UnquotedValue.begin(), i);
        Storage.insert(Storage.end(), Valid.begin(), Valid.end());
        Storage.push_back('\'');
        UnquotedValue = UnquotedValue.substr(i + 2);
      }
      Storage.insert(Storage.end(), UnquotedValue.begin(), UnquotedValue.end());
      return StringRef(Storage.begin(), Storage.size());
    }
    return UnquotedValue;
  }
  // Plain or block.
  return Value.rtrim(' ');
}